

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O3

cbtBvhTriangleMeshShape * __thiscall
cbtCollisionWorldImporter::createBvhTriangleMeshShape
          (cbtCollisionWorldImporter *this,cbtStridingMeshInterface *trimesh,cbtOptimizedBvh *bvh)

{
  cbtCollisionShape **ptr;
  uint uVar1;
  cbtBvhTriangleMeshShape *this_00;
  cbtCollisionShape **ppcVar2;
  ulong uVar3;
  int iVar4;
  cbtVector3 local_38;
  
  this_00 = (cbtBvhTriangleMeshShape *)cbtAlignedAllocInternal(0x68,0x10);
  if (bvh == (cbtOptimizedBvh *)0x0) {
    cbtBvhTriangleMeshShape::cbtBvhTriangleMeshShape(this_00,trimesh,true,true);
    uVar1 = (this->m_allocatedCollisionShapes).m_size;
    if (uVar1 != (this->m_allocatedCollisionShapes).m_capacity) goto LAB_008b47cf;
    iVar4 = 1;
    if (uVar1 != 0) {
      iVar4 = uVar1 * 2;
    }
    if (iVar4 <= (int)uVar1) goto LAB_008b47cf;
    if (iVar4 == 0) {
      ppcVar2 = (cbtCollisionShape **)0x0;
    }
    else {
      ppcVar2 = (cbtCollisionShape **)cbtAlignedAllocInternal((long)iVar4 << 3,0x10);
      uVar1 = (this->m_allocatedCollisionShapes).m_size;
    }
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        ppcVar2[uVar3] = (this->m_allocatedCollisionShapes).m_data[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else {
    cbtBvhTriangleMeshShape::cbtBvhTriangleMeshShape
              (this_00,trimesh,(bvh->super_cbtQuantizedBvh).m_useQuantization,false);
    local_38.m_floats[0] = 1.0;
    local_38.m_floats[1] = 1.0;
    local_38.m_floats[2] = 1.0;
    local_38.m_floats[3] = 0.0;
    cbtBvhTriangleMeshShape::setOptimizedBvh(this_00,bvh,&local_38);
    uVar1 = (this->m_allocatedCollisionShapes).m_size;
    if (uVar1 != (this->m_allocatedCollisionShapes).m_capacity) goto LAB_008b47cf;
    iVar4 = 1;
    if (uVar1 != 0) {
      iVar4 = uVar1 * 2;
    }
    if (iVar4 <= (int)uVar1) goto LAB_008b47cf;
    if (iVar4 == 0) {
      ppcVar2 = (cbtCollisionShape **)0x0;
    }
    else {
      ppcVar2 = (cbtCollisionShape **)cbtAlignedAllocInternal((long)iVar4 << 3,0x10);
      uVar1 = (this->m_allocatedCollisionShapes).m_size;
    }
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        ppcVar2[uVar3] = (this->m_allocatedCollisionShapes).m_data[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  ptr = (this->m_allocatedCollisionShapes).m_data;
  if ((ptr != (cbtCollisionShape **)0x0) &&
     ((this->m_allocatedCollisionShapes).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr);
    uVar1 = (this->m_allocatedCollisionShapes).m_size;
  }
  (this->m_allocatedCollisionShapes).m_ownsMemory = true;
  (this->m_allocatedCollisionShapes).m_data = ppcVar2;
  (this->m_allocatedCollisionShapes).m_capacity = iVar4;
LAB_008b47cf:
  (this->m_allocatedCollisionShapes).m_data[(int)uVar1] = (cbtCollisionShape *)this_00;
  (this->m_allocatedCollisionShapes).m_size = uVar1 + 1;
  return this_00;
}

Assistant:

cbtBvhTriangleMeshShape* cbtCollisionWorldImporter::createBvhTriangleMeshShape(cbtStridingMeshInterface* trimesh, cbtOptimizedBvh* bvh)
{
	if (bvh)
	{
		cbtBvhTriangleMeshShape* bvhTriMesh = new cbtBvhTriangleMeshShape(trimesh, bvh->isQuantized(), false);
		bvhTriMesh->setOptimizedBvh(bvh);
		m_allocatedCollisionShapes.push_back(bvhTriMesh);
		return bvhTriMesh;
	}

	cbtBvhTriangleMeshShape* ts = new cbtBvhTriangleMeshShape(trimesh, true);
	m_allocatedCollisionShapes.push_back(ts);
	return ts;
}